

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

OutRec * ClipperLib::GetLowermostRec(OutRec *outRec1,OutRec *outRec2)

{
  OutPt *btmPt2;
  long lVar1;
  long lVar2;
  bool bVar3;
  OutPt *pOVar4;
  OutRec *pOVar5;
  
  if (outRec1->BottomPt == (OutPt *)0x0) {
    pOVar4 = GetBottomPt(outRec1->Pts);
    outRec1->BottomPt = pOVar4;
  }
  if (outRec2->BottomPt == (OutPt *)0x0) {
    pOVar4 = GetBottomPt(outRec2->Pts);
    outRec2->BottomPt = pOVar4;
  }
  pOVar4 = outRec1->BottomPt;
  btmPt2 = outRec2->BottomPt;
  lVar1 = (btmPt2->Pt).Y;
  lVar2 = (pOVar4->Pt).Y;
  pOVar5 = outRec1;
  if ((lVar2 <= lVar1) && (pOVar5 = outRec2, lVar1 <= lVar2)) {
    lVar1 = (btmPt2->Pt).X;
    lVar2 = (pOVar4->Pt).X;
    pOVar5 = outRec1;
    if (((lVar1 <= lVar2) &&
        (((pOVar5 = outRec2, lVar2 <= lVar1 && (pOVar4->Next != pOVar4)) &&
         (pOVar5 = outRec1, btmPt2->Next != btmPt2)))) &&
       (bVar3 = FirstIsBottomPt(pOVar4,btmPt2), !bVar3)) {
      pOVar5 = outRec2;
    }
  }
  return pOVar5;
}

Assistant:

OutRec* GetLowermostRec(OutRec *outRec1, OutRec *outRec2)
{
  //work out which polygon fragment has the correct hole state ...
  if (!outRec1->BottomPt) 
    outRec1->BottomPt = GetBottomPt(outRec1->Pts);
  if (!outRec2->BottomPt) 
    outRec2->BottomPt = GetBottomPt(outRec2->Pts);
  OutPt *OutPt1 = outRec1->BottomPt;
  OutPt *OutPt2 = outRec2->BottomPt;
  if (OutPt1->Pt.Y > OutPt2->Pt.Y) return outRec1;
  else if (OutPt1->Pt.Y < OutPt2->Pt.Y) return outRec2;
  else if (OutPt1->Pt.X < OutPt2->Pt.X) return outRec1;
  else if (OutPt1->Pt.X > OutPt2->Pt.X) return outRec2;
  else if (OutPt1->Next == OutPt1) return outRec2;
  else if (OutPt2->Next == OutPt2) return outRec1;
  else if (FirstIsBottomPt(OutPt1, OutPt2)) return outRec1;
  else return outRec2;
}